

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

void __thiscall
compressed_sparse_matrix<filtration_entry_t>::push_back
          (compressed_sparse_matrix<filtration_entry_t> *this,filtration_entry_t e)

{
  iterator *piVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer pfVar3;
  _Elt_pointer puVar4;
  filtration_entry_t local_18;
  
  local_18.super_pair<float,_long>.second = e.super_pair<float,_long>.second;
  local_18.super_pair<float,_long>.first = e.super_pair<float,_long>.first;
  ppuVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_start._M_last -
       (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur -
       (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppuVar2 -
                (long)(this->bounds).
                      super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x40 != 0) {
    pfVar3 = (this->entries).
             super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pfVar3 == (this->entries).
                  super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
                  .super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<filtration_entry_t,std::allocator<filtration_entry_t>>::
      _M_push_back_aux<filtration_entry_t_const&>
                ((deque<filtration_entry_t,std::allocator<filtration_entry_t>> *)&this->entries,
                 &local_18);
    }
    else {
      *(ulong *)&pfVar3->super_pair<float,_long> =
           CONCAT44(local_18.super_pair<float,_long>._4_4_,local_18.super_pair<float,_long>.first);
      (pfVar3->super_pair<float,_long>).second = local_18.super_pair<float,_long>.second;
      piVar1 = &(this->entries).
                super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    puVar4 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (puVar4 == (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar4 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    puVar4[-1] = puVar4[-1] + 1;
    return;
  }
  __assert_fail("0 < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xbb,
                "void compressed_sparse_matrix<filtration_entry_t>::push_back(ValueType) [ValueType = filtration_entry_t]"
               );
}

Assistant:

void push_back(ValueType e) {
		assert(0 < size());
		entries.push_back(e);
		++bounds.back();
	}